

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<unsigned_int,_false,_false>::grow
          (FastVector<unsigned_int,_false,_false> *this,uint newSize)

{
  uint *puVar1;
  
  puVar1 = this->data;
  grow_no_destroy(this,newSize);
  if (puVar1 != (uint *)0x0) {
    (*(code *)NULLC::dealloc)(puVar1);
    return;
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}